

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

int str_to_regex(char *str,regex_t *reg)

{
  re_t __src;
  regex_t *result;
  char *p;
  regex_t *reg_local;
  char *str_local;
  
  for (result = (regex_t *)str; result->type != '\0'; result = (regex_t *)&result->field_0x1) {
    if (result->type == ' ') {
      result->type = '|';
    }
  }
  __src = re_compile(str);
  memcpy(reg,__src,0x2000);
  return 0;
}

Assistant:

static int str_to_regex(char *str, regex_t *reg)
{
    char *p = str;
    regex_t *result;

    while (*p) {
        if (*p == ' ') *p = '|';
        p++;
    }

    result = re_compile(str);

    memcpy(reg, result, REGEXP_SIZE);

    return 0;
}